

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerHLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Parameter *arg,uint32_t id)

{
  SPIRType *pSVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long local_50;
  long lStack_48;
  string local_40;
  
  CompilerGLSL::to_func_call_arg_abi_cxx11_(__return_storage_ptr__,&this->super_CompilerGLSL,arg,id)
  ;
  if (0x1e < (this->hlsl_options).shader_model) {
    pSVar1 = Compiler::expression_type((Compiler *)this,id);
    if ((*(int *)&(pSVar1->super_IVariant).field_0xc == 0x11) && ((pSVar1->image).dim != DimBuffer))
    {
      to_sampler_expression_abi_cxx11_(&local_40,this,id);
      plVar2 = (long *)::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x376a17);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_50 = *plVar3;
        lStack_48 = plVar2[3];
        plVar4 = &local_50;
      }
      else {
        local_50 = *plVar3;
        plVar4 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar4);
      if (plVar4 != &local_50) {
        operator_delete(plVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str = CompilerGLSL::to_func_call_arg(arg, id);

	if (hlsl_options.shader_model <= 30)
		return arg_str;

	// Manufacture automatic sampler arg if the arg is a SampledImage texture and we're in modern HLSL.
	auto &type = expression_type(id);

	// We don't have to consider combined image samplers here via OpSampledImage because
	// those variables cannot be passed as arguments to functions.
	// Only global SampledImage variables may be used as arguments.
	if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		arg_str += ", " + to_sampler_expression(id);

	return arg_str;
}